

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
          (InternalMetadata *this)

{
  ContainerBase *pCVar1;
  InternalMetadata *in_RDI;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *container;
  Arena *my_arena;
  size_t n;
  size_t in_stack_ffffffffffffff40;
  ArenaImpl *in_stack_ffffffffffffff50;
  InternalMetadata *pIVar2;
  size_t in_stack_ffffffffffffff68;
  ArenaImpl *this_00;
  ArenaImpl *local_78;
  undefined8 *local_38;
  
  pIVar2 = in_RDI;
  if (((uint)in_RDI->ptr_ & 1) == 1) {
    pCVar1 = PtrValue<google::protobuf::internal::InternalMetadata::ContainerBase>(in_RDI);
    local_78 = (ArenaImpl *)pCVar1->arena;
  }
  else {
    local_78 = (ArenaImpl *)PtrValue<google::protobuf::Arena>(in_RDI);
  }
  if (local_78 == (ArenaImpl *)0x0) {
    local_38 = (undefined8 *)operator_new(0x28);
    memset(local_38,0,0x28);
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Container((Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x452cd0);
    this_00 = local_78;
  }
  else {
    this_00 = local_78;
    AlignUpTo8(0x28);
    ArenaImpl::RecordAlloc
              (in_stack_ffffffffffffff50,(type_info *)local_78,in_stack_ffffffffffffff40);
    local_38 = (undefined8 *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (this_00,in_stack_ffffffffffffff68,(_func_void_void_ptr *)pIVar2);
    memset(local_38,0,0x28);
    Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    Container((Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x452db9);
  }
  in_RDI->ptr_ = local_38;
  in_RDI->ptr_ = (void *)((ulong)in_RDI->ptr_ | 1);
  *local_38 = this_00;
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_38 + 1);
}

Assistant:

PROTOBUF_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container<T>* container = Arena::Create<Container<T>>(my_arena);
    // Two-step assignment works around a bug in clang's static analyzer:
    // https://bugs.llvm.org/show_bug.cgi?id=34198.
    ptr_ = container;
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(ptr_) |
                                   kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }